

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O2

string * __thiscall
ninx::lexer::Reader::read_identifier_abi_cxx11_
          (string *__return_storage_ptr__,Reader *this,int *trailing_spaces,int target_suffix,
          bool *found)

{
  pointer pcVar1;
  bool *pbVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  LexerException *this_00;
  char current;
  allocator local_65;
  int local_64;
  bool *local_60;
  int *local_58;
  string local_50;
  
  pcVar1 = (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish != pcVar1) {
    (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
  }
  local_64 = target_suffix;
  local_60 = found;
  local_58 = trailing_spaces;
  while (((byte)this->stream[*(long *)(*(long *)this->stream + -0x18) + 0x20] & 5) == 0) {
    cVar3 = std::istream::peek();
    iVar5 = isspace((int)cVar3);
    if (iVar5 != 0) break;
    bVar4 = is_limiter(cVar3);
    if (cVar3 != '_' && bVar4) break;
    cVar3 = std::istream::get();
    current = cVar3;
    if (cVar3 == -1) break;
    iVar5 = isalpha((int)cVar3);
    if ((((int)cVar3 - 0x3aU < 0xfffffff6 && iVar5 == 0) && (cVar3 != '.')) && (cVar3 != '_')) {
      this_00 = (LexerException *)__cxa_allocate_exception(0x20);
      iVar5 = this->line_number;
      std::__cxx11::string::string
                ((string *)&local_50,"Identifier can only contain alphanumeric characters.",
                 &local_65);
      exception::LexerException::LexerException(this_00,iVar5,&this->origin,&local_50);
      __cxa_throw(this_00,&exception::LexerException::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<char,_std::allocator<char>_>::push_back(&this->buffer,&current);
  }
  local_50._M_dataplus._M_p = local_50._M_dataplus._M_p & 0xffffffffffffff00;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(&this->buffer,(char *)&local_50);
  pbVar2 = local_60;
  iVar5 = local_64;
  *local_60 = false;
  if (local_64 != -1) {
    iVar6 = std::istream::peek();
    if (iVar6 == iVar5) {
      std::istream::get();
      *pbVar2 = true;
    }
  }
  iVar5 = ignore_spaces(this);
  *local_58 = iVar5;
  std::__cxx11::string::string
            ((string *)&local_50,
             (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,(allocator *)&current);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_50.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,local_50.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_50._M_string_length;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::lexer::Reader::read_identifier(int &trailing_spaces, int target_suffix, bool &found) {
    this->buffer.clear();

    while (stream) {
        // An identifier is valid until a space or a limiter is found
        char next_char = static_cast<char>(stream.peek());
        if (isspace(next_char) || (is_limiter(next_char) && next_char != '_')) {
            break;
        }

        // Read the current char
        char current = static_cast<char>(stream.get());
        if (current == -1) {
            break;
        }

        // If the current char is not alphanumeric, underscore or dot ( used to call nested methods and variables ),
        // raise an exception
        if (isalpha(current) == 0 && isdigit(current) == 0 && current != '.' && current != '_') {
            throw LexerException(this->line_number, this->origin,
                                 "Identifier can only contain alphanumeric characters.");
        }

        this->buffer.push_back(current);
    }

    this->buffer.push_back(0);

    found = false;
    if (target_suffix != -1 && stream.peek() == target_suffix) {
        stream.get();
        found = true;
    }

    trailing_spaces = ignore_spaces();

    return std::move(std::string{buffer.data()});
}